

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O1

int snprintf_s_s(char *dest,rsize_t dmax,char *format,char *s)

{
  uint uVar1;
  int iVar2;
  char pformatList [16];
  char local_38 [24];
  
  uVar1 = parse_format(format,local_38,0x10);
  if (uVar1 == 1) {
    if (local_38[0] == 's') {
      iVar2 = __snprintf_chk(dest,dmax,1,0xffffffffffffffff,format,s);
      return iVar2;
    }
    *dest = '\0';
    iVar2 = -0x19b;
  }
  else {
    *dest = '\0';
    iVar2 = -0x19a;
  }
  return iVar2;
}

Assistant:

inline int snprintf_s_s(char *dest, rsize_t dmax, const char *format, char *s)
{
    char pformatList[MAX_FORMAT_ELEMENTS];
    unsigned int index = 0;

	// Determine the number of format options in the format string
	unsigned int  nfo = parse_format(format, &pformatList[0], MAX_FORMAT_ELEMENTS);

	// Check that there are not too many format options
	if ( nfo != 1 ) {
		dest[0] = '\0';
		return SNPRFNEGATE(ESBADFMT);
	}
	// Check first format is of string type
	if ( CHK_FORMAT(FMT_STRING, pformatList[index]) == 0) {
		dest[0] = '\0';
		return SNPRFNEGATE(ESFMTTYP);
	}
	index++;

	return snprintf(dest, dmax, format, s);
}